

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O2

void debug_buffer(FILE *fp,bcf_sr_t *reader)

{
  bcf1_t *pbVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  
  for (lVar5 = 0; lVar5 <= reader->nbuffer; lVar5 = lVar5 + 1) {
    pcVar3 = "";
    if (lVar5 == 0) {
      pcVar3 = "*";
    }
    pbVar1 = reader->buffer[lVar5];
    pcVar2 = "";
    if (*(short *)&pbVar1->field_0x12 != 0) {
      pcVar2 = *(pbVar1->d).allele;
    }
    fprintf((FILE *)fp,"%s%s\t%s:%d\t%s ",reader->fname,pcVar3,
            reader->header->id[1][pbVar1->rid].key,(ulong)(pbVar1->pos + 1),pcVar2);
    for (uVar4 = 1; uVar4 < *(ushort *)&pbVar1->field_0x12; uVar4 = uVar4 + 1) {
      fprintf((FILE *)fp," %s",(pbVar1->d).allele[uVar4]);
    }
    fputc(10,(FILE *)fp);
  }
  return;
}

Assistant:

void debug_buffer(FILE *fp, bcf_sr_t *reader)
{
    int j;
    for (j=0; j<=reader->nbuffer; j++)
    {
        bcf1_t *line = reader->buffer[j];
        fprintf(fp,"%s%s\t%s:%d\t%s ", reader->fname,j==0?"*":"",reader->header->id[BCF_DT_CTG][line->rid].key,line->pos+1,line->n_allele?line->d.allele[0]:"");
        int k;
        for (k=1; k<line->n_allele; k++) fprintf(fp," %s", line->d.allele[k]);
        fprintf(fp,"\n");
    }
}